

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzP::NodeIntToDescriptor
          (ChNodeFEAxyzP *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R)

{
  double dVar1;
  undefined1 *this_00;
  ulong uVar2;
  double *local_38;
  long local_30;
  
  uVar2 = (ulong)off_v;
  if ((long)uVar2 <
      (v->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    dVar1 = (v->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar2];
    this_00 = &(this->super_ChNodeFEAbase).field_0x18;
    ChVariables::Get_qb((ChVectorRef *)&local_38,(ChVariables *)this_00);
    if (0 < local_30) {
      *local_38 = dVar1;
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar2) goto LAB_00662f58;
      dVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [uVar2];
      ChVariables::Get_fb((ChVectorRef *)&local_38,(ChVariables *)this_00);
      if (0 < local_30) {
        *local_38 = dVar1;
        return;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_00662f58:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChNodeFEAxyzP::NodeIntToDescriptor(const unsigned int off_v, const ChStateDelta& v, const ChVectorDynamic<>& R) {
    variables.Get_qb()(0) = v(off_v);
    variables.Get_fb()(0) = R(off_v);
}